

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

int stbir__perform_resize(stbir__info *info,int split_start,int split_count)

{
  stbir__per_split_info *split_info;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  stbir__per_split_info *psVar6;
  float *pfVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  float *pfVar11;
  float *pfVar12;
  STBIR_VERTICAL_GATHERFUNC **ppSVar13;
  float *pfVar14;
  STBIR_VERTICAL_SCATTERFUNC **ppSVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  stbir__per_split_info *psVar22;
  stbir__contributors *psVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  float *local_108;
  code *local_c8;
  float *local_78 [9];
  
  psVar6 = info->split_info;
  split_info = psVar6 + (uint)split_start;
  psVar23 = (info->vertical).contributors;
  pfVar11 = (info->vertical).coefficients;
  iVar1 = psVar6[(uint)split_start].start_output_y;
  iVar2 = split_info[(long)split_count + -1].end_output_y;
  if ((info->vertical).is_gather == 0) {
    iVar19 = split_info->start_input_y;
    if (info->vertical_first == 0) {
      psVar22 = (stbir__per_split_info *)&split_info->vertical_buffer;
      iVar18 = (info->horizontal).scale_info.output_sub_size;
      local_c8 = stbir__encode_first_scanline_from_scatter;
    }
    else {
      iVar18 = ((info->scanline_extents).conservative.n1 - (info->scanline_extents).conservative.n0)
               + 1;
      local_c8 = stbir__horizontal_resample_and_encode_first_scanline_from_scatter;
      psVar22 = split_info;
    }
    iVar16 = (info->vertical).filter_pixel_margin;
    iVar25 = (info->vertical).coefficient_width;
    iVar3 = split_info[(long)split_count + -1].end_input_y;
    pfVar7 = psVar22->decode_buffer;
    iVar4 = info->effective_channels;
    split_info->ring_buffer_first_scanline = iVar1;
    split_info->ring_buffer_last_scanline = -1;
    split_info->ring_buffer_begin_index = -1;
    if (0 < info->ring_buffer_num_entries) {
      iVar21 = 0;
      do {
        *(float *)((long)split_info->ring_buffer +
                  (long)info->ring_buffer_length_bytes * (long)iVar21) = 3e+38;
        iVar21 = iVar21 + 1;
      } while (iVar21 < info->ring_buffer_num_entries);
    }
    iVar21 = iVar19;
    if (iVar19 < iVar3) {
      lVar24 = (long)iVar16 + (long)iVar19;
      psVar23 = psVar23 + lVar24;
      pfVar11 = pfVar11 + (long)iVar25 * (long)(int)lVar24;
      bVar9 = true;
      iVar16 = iVar19;
      do {
        iVar25 = psVar23->n0;
        iVar5 = psVar23->n1;
        if (info->ring_buffer_num_entries <= iVar5 - iVar25) {
          __assert_fail("out_last_scanline - out_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                        ,0x191c,
                        "void stbir__vertical_scatter_loop(const stbir__info *, stbir__per_split_info *, int)"
                       );
        }
        if ((iVar25 <= iVar5) &&
           (((iVar1 <= iVar25 && (iVar25 < iVar2)) || ((iVar1 <= iVar5 && (iVar5 < iVar2)))))) {
          if ((bVar9) && (iVar19 < iVar16)) {
            split_info->start_input_y = iVar16;
          }
          iVar21 = iVar1;
          if (iVar25 - iVar1 != 0 && iVar1 <= iVar25) {
            iVar21 = iVar25;
          }
          iVar8 = -(iVar25 - iVar1);
          if (iVar1 <= iVar25) {
            iVar8 = 0;
          }
          if (iVar2 <= iVar5) {
            iVar5 = iVar2 + -1;
          }
          if (split_info->ring_buffer_begin_index < 0) {
            split_info->ring_buffer_begin_index = iVar21 - iVar1;
          }
          if (iVar21 < split_info->ring_buffer_begin_index) {
            __assert_fail("split_info->ring_buffer_begin_index <= out_first_scanline",
                          "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                          ,0x1936,
                          "void stbir__vertical_scatter_loop(const stbir__info *, stbir__per_split_info *, int)"
                         );
          }
          stbir__decode_scanline(info,iVar16,split_info->decode_buffer);
          if (info->vertical_first == 0) {
            stbir__resample_horizontal_gather
                      (info,split_info->vertical_buffer,split_info->decode_buffer);
          }
          if (((split_info->ring_buffer_last_scanline - split_info->ring_buffer_first_scanline) + 1
               == info->ring_buffer_num_entries) && (split_info->ring_buffer_last_scanline < iVar5))
          {
            (*local_c8)(info,split_info);
          }
          if ((info->vertical).is_gather != 0) {
            __assert_fail("!stbir_info->vertical.is_gather",
                          "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                          ,0x18c8,
                          "void stbir__resample_vertical_scatter(const stbir__info *, stbir__per_split_info *, int, int, const float *, const float *, const float *)"
                         );
          }
          if (iVar5 - iVar21 < 0) {
            __assert_fail("total > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                          ,0x18cd,
                          "void stbir__resample_vertical_scatter(const stbir__info *, stbir__per_split_info *, int, int, const float *, const float *, const float *)"
                         );
          }
          uVar20 = (iVar5 - iVar21) + 1;
          iVar25 = 0;
          do {
            uVar26 = 8;
            if ((int)uVar20 < 8) {
              uVar26 = (ulong)uVar20;
            }
            iVar17 = (int)uVar26;
            if (0 < (int)uVar20) {
              uVar27 = 0;
              do {
                pfVar14 = stbir__get_ring_buffer_scanline
                                    (info,split_info,(int)uVar27 + iVar21 + iVar25);
                local_78[uVar27] = pfVar14;
                if ((uVar27 != 0) &&
                   (iVar17 = (int)uVar27, (*pfVar14 == 3e+38) == (*local_78[0] != 3e+38))) break;
                uVar27 = uVar27 + 1;
                iVar17 = (int)uVar26;
              } while (uVar26 != uVar27);
            }
            ppSVar15 = stbir__vertical_scatter_sets;
            if (*local_78[0] != 3e+38) {
              ppSVar15 = stbir__vertical_scatter_blends;
            }
            if (NAN(*local_78[0])) {
              ppSVar15 = stbir__vertical_scatter_blends;
            }
            (*ppSVar15[(long)iVar17 + -1])
                      (local_78,pfVar11 + (long)iVar8 + (long)iVar25,pfVar7,
                       pfVar7 + (long)iVar4 * (long)iVar18);
            iVar25 = iVar25 + iVar17;
            uVar20 = uVar20 - iVar17;
          } while (uVar20 != 0);
          bVar9 = false;
          iVar21 = iVar16;
          if (split_info->ring_buffer_last_scanline < iVar5) {
            split_info->ring_buffer_last_scanline = iVar5;
          }
        }
        psVar23 = psVar23 + 1;
        pfVar11 = pfVar11 + (info->vertical).coefficient_width;
        iVar16 = iVar16 + 1;
      } while (iVar16 != iVar3);
    }
    iVar1 = split_info->ring_buffer_first_scanline;
    while (iVar1 < iVar2) {
      (*local_c8)(info,split_info);
      iVar1 = split_info->ring_buffer_first_scanline;
    }
    pfVar11 = (float *)(ulong)(uint)split_count;
    if (0 < split_count) {
      pfVar11 = (float *)((ulong)(uint)split_count * 0x78);
      lVar24 = 0;
      do {
        if (iVar21 + 1 < *(int *)(psVar6[(uint)split_start].no_cache_straddle + lVar24 + -0x18)) {
          *(int *)(psVar6[(uint)split_start].no_cache_straddle + lVar24 + -0x18) = iVar21 + 1;
        }
        lVar24 = lVar24 + 0x78;
      } while ((long)pfVar11 - lVar24 != 0);
    }
  }
  else {
    lVar24 = (long)iVar1;
    iVar19 = (info->vertical).coefficient_width;
    split_info->ring_buffer_begin_index = 0;
    iVar18 = psVar23[lVar24].n0;
    split_info->ring_buffer_first_scanline = iVar18;
    split_info->ring_buffer_last_scanline = iVar18 + -1;
    if (iVar1 < iVar2) {
      psVar23 = psVar23 + lVar24;
      local_108 = pfVar11 + iVar19 * lVar24;
      do {
        iVar1 = psVar23->n0;
        if (iVar1 < split_info->ring_buffer_first_scanline) {
          __assert_fail("in_first_scanline >= split_info->ring_buffer_first_scanline",
                        "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                        ,0x187b,
                        "void stbir__vertical_gather_loop(const stbir__info *, stbir__per_split_info *, int)"
                       );
        }
        iVar19 = psVar23->n1;
        iVar18 = split_info->ring_buffer_last_scanline;
        while (iVar18 < iVar19) {
          iVar16 = iVar18 - split_info->ring_buffer_first_scanline;
          if (info->ring_buffer_num_entries <= iVar16) {
            __assert_fail("( split_info->ring_buffer_last_scanline - split_info->ring_buffer_first_scanline + 1 ) <= stbir_info->ring_buffer_num_entries"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                          ,0x1880,
                          "void stbir__vertical_gather_loop(const stbir__info *, stbir__per_split_info *, int)"
                         );
          }
          if (iVar16 + 1 == info->ring_buffer_num_entries) {
            split_info->ring_buffer_first_scanline = split_info->ring_buffer_first_scanline + 1;
            split_info->ring_buffer_begin_index = split_info->ring_buffer_begin_index + 1;
          }
          iVar18 = iVar18 + 1;
          if (info->vertical_first == 0) {
            stbir__decode_scanline(info,iVar18,split_info->decode_buffer);
            split_info->ring_buffer_last_scanline = iVar18;
            if (info->ring_buffer_num_entries < 0) {
              __assert_fail("index < stbir_info->ring_buffer_num_entries",
                            "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                            ,0x1808,
                            "float *stbir__get_ring_buffer_entry(const stbir__info *, const stbir__per_split_info *, int)"
                           );
            }
            stbir__resample_horizontal_gather
                      (info,(float *)((long)(((iVar18 + split_info->ring_buffer_begin_index) -
                                             split_info->ring_buffer_first_scanline) %
                                            info->ring_buffer_num_entries) *
                                      (long)info->ring_buffer_length_bytes +
                                     (long)split_info->ring_buffer),split_info->decode_buffer);
          }
          else {
            split_info->ring_buffer_last_scanline = iVar18;
            pfVar11 = stbir__get_ring_buffer_scanline(info,split_info,iVar18);
            stbir__decode_scanline(info,split_info->ring_buffer_last_scanline,pfVar11);
          }
          iVar18 = split_info->ring_buffer_last_scanline;
        }
        iVar18 = info->vertical_first;
        if (iVar18 == 0) {
          iVar16 = (info->horizontal).scale_info.output_sub_size;
        }
        else {
          iVar16 = ((info->scanline_extents).conservative.n1 -
                   (info->scanline_extents).conservative.n0) + 1;
        }
        if ((info->vertical).is_gather == 0) {
          __assert_fail("stbir_info->vertical.is_gather",
                        "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                        ,0x182c,
                        "void stbir__resample_vertical_gather(const stbir__info *, stbir__per_split_info *, int, int, int, const float *)"
                       );
        }
        iVar19 = iVar19 - iVar1;
        if (iVar19 < 0) {
          __assert_fail("total > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                        ,0x1832,
                        "void stbir__resample_vertical_gather(const stbir__info *, stbir__per_split_info *, int, int, int, const float *)"
                       );
        }
        pfVar11 = split_info->decode_buffer;
        pfVar7 = split_info->vertical_buffer;
        iVar25 = info->effective_channels;
        uVar20 = iVar19 + 1;
        pfVar14 = pfVar11;
        if (iVar18 == 0) {
          pfVar14 = pfVar7;
        }
        iVar19 = 0;
        do {
          uVar10 = 8;
          if ((int)uVar20 < 8) {
            uVar10 = uVar20;
          }
          if (0 < (int)uVar20) {
            uVar26 = 0;
            do {
              pfVar12 = stbir__get_ring_buffer_scanline
                                  (info,split_info,iVar1 + iVar19 + (int)uVar26);
              local_78[uVar26] = pfVar12;
              uVar26 = uVar26 + 1;
            } while (uVar10 != uVar26);
          }
          ppSVar13 = stbir__vertical_gathers_continues;
          if (iVar19 == 0) {
            ppSVar13 = stbir__vertical_gathers;
          }
          (*ppSVar13[(long)(int)uVar10 + -1])
                    (pfVar14,local_108 + iVar19,local_78,local_78[0] + (long)iVar16 * (long)iVar25);
          iVar19 = iVar19 + uVar10;
          uVar20 = uVar20 - uVar10;
        } while (uVar20 != 0);
        if (iVar18 != 0) {
          stbir__resample_horizontal_gather(info,pfVar7,pfVar11);
        }
        stbir__encode_scanline
                  (info,(void *)(info->output_stride_bytes * lVar24 + (long)info->output_data),
                   pfVar7,(int)lVar24);
        psVar23 = psVar23 + 1;
        pfVar11 = (float *)(long)(info->vertical).coefficient_width;
        local_108 = local_108 + (long)pfVar11;
        lVar24 = lVar24 + 1;
      } while (iVar2 != (int)lVar24);
    }
  }
  return (int)pfVar11;
}

Assistant:

static int stbir__perform_resize( stbir__info const * info, int split_start, int split_count )
{
  stbir__per_split_info * split_info = info->split_info + split_start;

  STBIR_PROFILE_CLEAR_EXTRAS();

  STBIR_PROFILE_FIRST_START( looping );
  if (info->vertical.is_gather)
    stbir__vertical_gather_loop( info, split_info, split_count );
  else
    stbir__vertical_scatter_loop( info, split_info, split_count );
  STBIR_PROFILE_END( looping );

  return 1;
}